

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O1

Byte ppmd_read(void *p)

{
  archive_read *a;
  void *pvVar1;
  Byte *pBVar2;
  Byte BVar3;
  void *pvVar4;
  ssize_t bytes_avail;
  ssize_t local_28;
  
  a = *p;
  pvVar1 = a->format->data;
  if (*(long *)((long)pvVar1 + 0x4de0) < 1) {
    local_28 = 0;
    pvVar4 = __archive_read_ahead(a,*(long *)((long)pvVar1 + 0x4df0) + 1,&local_28);
    if (local_28 <= *(long *)((long)pvVar1 + 0x4df0)) {
      archive_set_error(&a->archive,0x54,"Truncated 7z file data");
      *(undefined4 *)((long)pvVar1 + 0x4e10) = 1;
      return '\0';
    }
    *(long *)((long)pvVar1 + 0x4dd8) = *(long *)((long)pvVar1 + 0x4dd8) + 1;
    BVar3 = *(Byte *)((long)pvVar4 + *(long *)((long)pvVar1 + 0x4df0));
  }
  else {
    pBVar2 = *(Byte **)((long)pvVar1 + 0x4dd8);
    *(Byte **)((long)pvVar1 + 0x4dd8) = pBVar2 + 1;
    BVar3 = *pBVar2;
  }
  *(long *)((long)pvVar1 + 0x4de0) = *(long *)((long)pvVar1 + 0x4de0) + -1;
  *(long *)((long)pvVar1 + 0x4de8) = *(long *)((long)pvVar1 + 0x4de8) + 1;
  *(long *)((long)pvVar1 + 0x4df0) = *(long *)((long)pvVar1 + 0x4df0) + 1;
  return BVar3;
}

Assistant:

static Byte
ppmd_read(void *p)
{
	struct archive_read *a = ((IByteIn*)p)->a;
	struct _7zip *zip = (struct _7zip *)(a->format->data);
	Byte b;

	if (zip->ppstream.avail_in <= 0) {
		/*
		 * Ppmd7_DecodeSymbol might require reading multiple bytes
		 * and we are on boundary;
		 * last resort to read using __archive_read_ahead.
		 */
		ssize_t bytes_avail = 0;
		const uint8_t* data = __archive_read_ahead(a,
		    zip->ppstream.stream_in+1, &bytes_avail);
		if(bytes_avail < zip->ppstream.stream_in+1) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated 7z file data");
			zip->ppstream.overconsumed = 1;
			return (0);
		}
		zip->ppstream.next_in++;
		b = data[zip->ppstream.stream_in];
	} else {
		b = *zip->ppstream.next_in++;
	}
	zip->ppstream.avail_in--;
	zip->ppstream.total_in++;
	zip->ppstream.stream_in++;
	return (b);
}